

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O0

string * __thiscall
re2c::InputAPI::expr_lessthan_one_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this)

{
  opt_t *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  InputAPI *local_18;
  InputAPI *this_local;
  
  local_18 = this;
  this_local = (InputAPI *)__return_storage_ptr__;
  if (this->type_ == DEFAULT) {
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_38,&poVar1->yylimit," <= ");
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(__return_storage_ptr__,&local_38,&poVar1->yycursor);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    expr_lessthan_abi_cxx11_(__return_storage_ptr__,this,1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::expr_lessthan_one () const
{
	return type_ == DEFAULT
		? opts->yylimit + " <= " + opts->yycursor
		: expr_lessthan (1);
}